

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5WriteFlushDlidx(Fts5Index *p,Fts5SegWriter *pWriter)

{
  int local_1c;
  int bFlag;
  Fts5SegWriter *pWriter_local;
  Fts5Index *p_local;
  
  local_1c = 0;
  if ((0 < (pWriter->aDlidx->buf).n) && (3 < pWriter->nEmpty)) {
    local_1c = 1;
  }
  fts5WriteDlidxClear(p,pWriter,local_1c);
  pWriter->nEmpty = 0;
  return local_1c;
}

Assistant:

static int fts5WriteFlushDlidx(Fts5Index *p, Fts5SegWriter *pWriter){
  int bFlag = 0;

  /* If there were FTS5_MIN_DLIDX_SIZE or more empty leaf pages written
  ** to the database, also write the doclist-index to disk.  */
  if( pWriter->aDlidx[0].buf.n>0 && pWriter->nEmpty>=FTS5_MIN_DLIDX_SIZE ){
    bFlag = 1;
  }
  fts5WriteDlidxClear(p, pWriter, bFlag);
  pWriter->nEmpty = 0;
  return bFlag;
}